

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffparsecompspec(fitsfile *fptr,char *compspec,int *status)

{
  int iVar1;
  ushort **ppuVar2;
  long lVar3;
  char *pcVar4;
  int *in_RDX;
  char *in_RSI;
  fitsfile *in_RDI;
  bool bVar5;
  double dVar6;
  float scale;
  float qlevel;
  long tilesize [6];
  int quantize_method;
  int smooth;
  int compresstype;
  int ii;
  char *ptr1;
  byte bVar7;
  ushort uVar8;
  uint in_stack_ffffffffffffff8c;
  undefined1 uVar10;
  undefined2 uVar9;
  uint ctype;
  float scale_00;
  float qlevel_00;
  long *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  fitsfile *in_stack_ffffffffffffffa8;
  int local_34;
  int local_30;
  int local_2c;
  char *local_28;
  int *local_20;
  char *local_18;
  fitsfile *local_10;
  int local_4;
  
  local_30 = 0xb;
  local_34 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&stack0xffffffffffffff98,0,0x30);
  qlevel_00 = -99.0;
  scale_00 = 0.0;
  for (local_28 = local_18; *local_28 == ' '; local_28 = local_28 + 1) {
  }
  iVar1 = strncmp(local_28,"compress",8);
  if ((iVar1 == 0) || (iVar1 = strncmp(local_28,"COMPRESS",8), iVar1 == 0)) {
    for (local_28 = local_28 + 8; *local_28 == ' '; local_28 = local_28 + 1) {
    }
    if ((*local_28 == 'r') || (*local_28 == 'R')) {
      local_30 = 0xb;
      while( true ) {
        ctype = in_stack_ffffffffffffff8c & 0xffffff;
        if ((*local_28 != ' ') && (ctype = in_stack_ffffffffffffff8c & 0xffffff, *local_28 != ';'))
        {
          ctype = CONCAT13(*local_28 != '\0',(int3)in_stack_ffffffffffffff8c);
        }
        if ((char)(ctype >> 0x18) == '\0') break;
        local_28 = local_28 + 1;
        in_stack_ffffffffffffff8c = ctype;
      }
    }
    else if ((*local_28 == 'g') || (*local_28 == 'G')) {
      local_30 = 0x15;
      while( true ) {
        uVar10 = (undefined1)(in_stack_ffffffffffffff8c >> 0x18);
        uVar8 = (ushort)in_stack_ffffffffffffff8c;
        in_stack_ffffffffffffff8c = CONCAT13(uVar10,(uint3)uVar8);
        if ((*local_28 != ' ') &&
           (in_stack_ffffffffffffff8c = CONCAT13(uVar10,(uint3)uVar8), *local_28 != ';')) {
          in_stack_ffffffffffffff8c = CONCAT13(uVar10,CONCAT12(*local_28 != '\0',uVar8));
        }
        ctype = in_stack_ffffffffffffff8c;
        if ((char)(in_stack_ffffffffffffff8c >> 0x10) == '\0') break;
        local_28 = local_28 + 1;
      }
    }
    else if ((*local_28 == 'p') || (*local_28 == 'P')) {
      local_30 = 0x1f;
      while( true ) {
        uVar9 = (undefined2)(in_stack_ffffffffffffff8c >> 0x10);
        bVar7 = (byte)in_stack_ffffffffffffff8c;
        in_stack_ffffffffffffff8c = CONCAT22(uVar9,(ushort)bVar7);
        if ((*local_28 != ' ') &&
           (in_stack_ffffffffffffff8c = CONCAT22(uVar9,(ushort)bVar7), *local_28 != ';')) {
          in_stack_ffffffffffffff8c = CONCAT22(uVar9,CONCAT11(*local_28 != '\0',bVar7));
        }
        ctype = in_stack_ffffffffffffff8c;
        if ((char)(in_stack_ffffffffffffff8c >> 8) == '\0') break;
        local_28 = local_28 + 1;
      }
    }
    else if ((*local_28 == 'h') || (ctype = in_stack_ffffffffffffff8c, *local_28 == 'H')) {
      local_30 = 0x29;
      local_28 = local_28 + 1;
      if ((*local_28 == 's') || (*local_28 == 'S')) {
        local_34 = 1;
      }
      while( true ) {
        ctype = (in_stack_ffffffffffffff8c >> 8) << 8;
        if ((*local_28 != ' ') && (ctype = (in_stack_ffffffffffffff8c >> 8) << 8, *local_28 != ';'))
        {
          ctype = CONCAT31((int3)(in_stack_ffffffffffffff8c >> 8),*local_28 != '\0');
        }
        if ((char)ctype == '\0') break;
        local_28 = local_28 + 1;
        in_stack_ffffffffffffff8c = ctype;
      }
    }
    for (; *local_28 == ' '; local_28 = local_28 + 1) {
    }
    local_2c = 0;
    while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*local_28] & 0x800) != 0 && local_2c < 9) {
      lVar3 = atol(local_28);
      *(long *)(&stack0xffffffffffffff98 + (long)local_2c * 8) = lVar3;
      local_2c = local_2c + 1;
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*local_28] & 0x800) != 0) {
        local_28 = local_28 + 1;
      }
      if (*local_28 == ',') {
        local_28 = local_28 + 1;
      }
      for (; *local_28 == ' '; local_28 = local_28 + 1) {
      }
    }
    if (*local_28 == ';') {
      do {
        local_28 = local_28 + 1;
      } while (*local_28 == ' ');
      while (*local_28 != '\0') {
        if ((*local_28 == 's') || (*local_28 == 'S')) {
          do {
            local_28 = local_28 + 1;
          } while (*local_28 == ' ');
          dVar6 = strtod(local_28,&local_28);
          scale_00 = (float)dVar6;
          while( true ) {
            bVar5 = true;
            if (*local_28 != ' ') {
              bVar5 = *local_28 == ',';
            }
            if (!bVar5) break;
            local_28 = local_28 + 1;
          }
        }
        else {
          if ((*local_28 != 'q') && (*local_28 != 'Q')) {
            *local_20 = 0x7d;
            return 0x7d;
          }
          pcVar4 = local_28 + 1;
          if ((*pcVar4 == 'z') || (*pcVar4 == 'Z')) {
            pcVar4 = local_28 + 2;
          }
          else if (*pcVar4 == '0') {
            pcVar4 = local_28 + 2;
          }
          while (local_28 = pcVar4, *local_28 == ' ') {
            pcVar4 = local_28 + 1;
          }
          dVar6 = strtod(local_28,&local_28);
          qlevel_00 = (float)dVar6;
          while( true ) {
            bVar5 = true;
            if (*local_28 != ' ') {
              bVar5 = *local_28 == ',';
            }
            if (!bVar5) break;
            local_28 = local_28 + 1;
          }
        }
      }
    }
    fits_set_compression_type((fitsfile *)CONCAT44(qlevel_00,scale_00),ctype,(int *)0x126aaf);
    fits_set_tile_dim(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                      (int *)CONCAT44(qlevel_00,scale_00));
    if (local_30 == 0x29) {
      fits_set_hcomp_scale(local_10,scale_00,local_20);
      fits_set_hcomp_smooth(local_10,local_34,local_20);
    }
    if ((qlevel_00 != -99.0) || (NAN(qlevel_00))) {
      fits_set_quantize_level(local_10,qlevel_00,local_20);
      fits_set_quantize_method((fitsfile *)CONCAT44(qlevel_00,scale_00),ctype,(int *)0x126b3b);
    }
    local_4 = *local_20;
  }
  else {
    *local_20 = 0x7d;
    local_4 = 0x7d;
  }
  return local_4;
}

Assistant:

int ffparsecompspec(fitsfile *fptr,  /* I - FITS file pointer               */
           char *compspec,     /* I - image compression specification */
           int *status)          /* IO - error status                       */
/*
  Parse the image compression specification that was give in square brackets
  following the output FITS file name, as in these examples:

    myfile.fits[compress]  - default Rice compression, row by row 
    myfile.fits[compress TYPE] -  the first letter of TYPE defines the
                                  compression algorithm:
                                   R = Rice
                                   G = GZIP
                                   H = HCOMPRESS
                                   HS = HCOMPRESS (with smoothing)
				   B - BZIP2
                                   P = PLIO

    myfile.fits[compress TYPE 100,100] - the numbers give the dimensions
                                         of the compression tiles.  Default
                                         is NAXIS1, 1, 1, ...

       other optional parameters may be specified following a semi-colon 
       
    myfile.fits[compress; q 8.0]          q specifies the floating point 
    mufile.fits[compress TYPE; q -.0002]        quantization level;
    myfile.fits[compress TYPE 100,100; q 10, s 25]  s specifies the HCOMPRESS
                                                     integer scaling parameter

The compression parameters are saved in the fptr->Fptr structure for use
when writing FITS images.

*/
{
    char *ptr1;

    /* initialize with default values */
    int ii, compresstype = RICE_1, smooth = 0;
    int quantize_method = SUBTRACTIVE_DITHER_1;
    long tilesize[MAX_COMPRESS_DIM] = {0,0,0,0,0,0};
    float qlevel = -99., scale = 0.;
    
    ptr1 = compspec;
    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    if (strncmp(ptr1, "compress", 8) && strncmp(ptr1, "COMPRESS", 8) )
    {
       /* apparently this string does not specify compression parameters */
       return(*status = URL_PARSE_ERROR);
    }

    ptr1 += 8;
    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    /* ========================= */
    /* look for compression type */
    /* ========================= */

    if (*ptr1 == 'r' || *ptr1 == 'R')
    {
        compresstype = RICE_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }
    else if (*ptr1 == 'g' || *ptr1 == 'G')
    {
        compresstype = GZIP_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;

    }
/*
    else if (*ptr1 == 'b' || *ptr1 == 'B')
    {
        compresstype = BZIP2_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;

    }
*/
    else if (*ptr1 == 'p' || *ptr1 == 'P')
    {
        compresstype = PLIO_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }
    else if (*ptr1 == 'h' || *ptr1 == 'H')
    {
        compresstype = HCOMPRESS_1;
        ptr1++;
        if (*ptr1 == 's' || *ptr1 == 'S')
           smooth = 1;  /* apply smoothing when uncompressing HCOMPRESSed image */

        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }

    /* ======================== */
    /* look for tile dimensions */
    /* ======================== */

    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    ii = 0;
    while (isdigit( (int) *ptr1) && ii < 9)
    {
       tilesize[ii] = atol(ptr1);  /* read the integer value */
       ii++;

       while (isdigit((int) *ptr1))    /* skip over the integer */
           ptr1++;

       if (*ptr1 == ',')
           ptr1++;   /* skip over the comma */
          
       while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;
    }

    /* ========================================================= */
    /* look for semi-colon, followed by other optional parameters */
    /* ========================================================= */

    if (*ptr1 == ';') {
        ptr1++;
        while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

          while (*ptr1 != 0) {  /* haven't reached end of string yet */

              if (*ptr1 == 's' || *ptr1 == 'S') {
                  /* this should be the HCOMPRESS "scale" parameter; default = 1 */
	   
                  ptr1++;
                  while (*ptr1 == ' ')    /* ignore leading blanks */
                      ptr1++;

                  scale = (float) strtod(ptr1, &ptr1);

                  while (*ptr1 == ' ' || *ptr1 == ',') /* skip over blanks or comma */
                     ptr1++;

            } else if (*ptr1 == 'q' || *ptr1 == 'Q') {
                /* this should be the floating point quantization parameter */

                  ptr1++;
                  if (*ptr1 == 'z' || *ptr1 == 'Z') {
                      /* use the subtractive_dither_2 option */
                      quantize_method = SUBTRACTIVE_DITHER_2;
                      ptr1++;
		  } else if (*ptr1 == '0') {
                      /* do not dither */
                      quantize_method = NO_DITHER;
                      ptr1++;
		  }

                  while (*ptr1 == ' ')    /* ignore leading blanks */
                      ptr1++;

                  qlevel = (float) strtod(ptr1, &ptr1);

                  while (*ptr1 == ' ' || *ptr1 == ',') /* skip over blanks or comma */
                     ptr1++;

            } else {
                return(*status = URL_PARSE_ERROR);
            }
        }
    }

    /* ================================= */
    /* finished parsing; save the values */
    /* ================================= */

    fits_set_compression_type(fptr, compresstype, status);
    fits_set_tile_dim(fptr, MAX_COMPRESS_DIM, tilesize, status);
 
    if (compresstype == HCOMPRESS_1) {
        fits_set_hcomp_scale (fptr, scale,  status);
        fits_set_hcomp_smooth(fptr, smooth, status);
    }

    if (qlevel != -99.) {
        fits_set_quantize_level(fptr, qlevel, status);
        fits_set_quantize_method(fptr, quantize_method, status);
    }

    return(*status);
}